

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O1

mz_bool tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 (*pamVar1) [288];
  mz_uint16 *pmVar2;
  char cVar3;
  byte *pbVar4;
  ushort uVar5;
  byte *pbVar6;
  mz_uint8 (*pamVar7) [288];
  long lVar8;
  mz_uint16 (*pamVar9) [288];
  int iVar10;
  long lVar11;
  uint uVar12;
  mz_uint len;
  uint uVar13;
  int iVar14;
  int iVar15;
  mz_uint16 *pmVar16;
  ulong uVar17;
  mz_uint8 *pmVar18;
  mz_uint8 *pmVar19;
  ulong *puVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  byte bVar24;
  byte bVar25;
  uint uVar26;
  byte *pbVar27;
  bool bVar28;
  mz_uint8 packed_code_sizes [320];
  mz_uint8 code_sizes_to_pack [320];
  byte abStack_2b8 [320];
  byte local_178 [328];
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar14 = 0x11f;
    lVar11 = 0x9067;
    do {
      if (lVar11 - 0x8f49U < 0x102) {
        iVar14 = 0x101;
        break;
      }
      iVar14 = iVar14 + -1;
      lVar8 = lVar11 + -0x14;
      lVar11 = lVar11 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar8) == '\0');
    iVar15 = 0x1f;
    lVar11 = 36999;
    do {
      if (lVar11 - 0x9069U < 2) {
        iVar15 = 1;
        break;
      }
      iVar15 = iVar15 + -1;
      lVar8 = lVar11 + -0x14;
      lVar11 = lVar11 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar8) == '\0');
    memcpy(local_178,d->m_huff_code_sizes,(long)iVar14);
    memcpy(local_178 + iVar14,d->m_huff_code_sizes + 1,(long)iVar15);
    pamVar1 = d->m_huff_count + 2;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0xe) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x16) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1e) = 0;
    pamVar9 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar9 + 2) + 0x24) = 0;
    if (iVar15 + iVar14 == 0) {
      uVar22 = 0;
      uVar21 = 0xff;
      uVar13 = 0;
      uVar12 = 0;
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x12;
      uVar23 = 0;
      uVar12 = 0;
      uVar13 = 0;
      uVar22 = 0;
      uVar17 = 0xff;
      do {
        bVar24 = local_178[uVar23];
        uVar21 = (ulong)bVar24;
        bVar25 = (byte)uVar17;
        if (uVar21 == 0) {
          if (uVar22 != 0) {
            if (uVar22 < 3) {
              (*pamVar1)[uVar17] = (*pamVar1)[uVar17] + (short)uVar22;
              uVar26 = uVar12;
              do {
                uVar12 = uVar26 + 1;
                abStack_2b8[uVar26] = bVar25;
                uVar22 = uVar22 - 1;
                uVar26 = uVar12;
              } while (uVar22 != 0);
            }
            else {
              pmVar16 = d->m_huff_count[2] + 0x10;
              *pmVar16 = *pmVar16 + 1;
              uVar26 = uVar12 + 1;
              abStack_2b8[uVar12] = 0x10;
              uVar12 = uVar12 + 2;
              abStack_2b8[uVar26] = (char)uVar22 - 3;
            }
          }
          uVar13 = uVar13 + 1;
          if (uVar13 == 0x8a) {
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar12] = 0x12;
            abStack_2b8[uVar12 + 1] = 0x7f;
LAB_00137da5:
            uVar12 = uVar12 + 2;
            uVar22 = 0;
            goto LAB_00137da8;
          }
          uVar22 = 0;
        }
        else {
          if (uVar13 != 0) {
            if (uVar13 < 3) {
              (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar13;
              uVar26 = uVar12;
              do {
                uVar12 = uVar26 + 1;
                abStack_2b8[uVar26] = 0;
                uVar13 = uVar13 - 1;
                uVar26 = uVar12;
              } while (uVar13 != 0);
            }
            else {
              bVar28 = uVar13 < 0xb;
              pmVar16 = pmVar2;
              if (bVar28) {
                pmVar16 = d->m_huff_count[2] + 0x11;
              }
              *pmVar16 = *pmVar16 + 1;
              abStack_2b8[uVar12] = 0x12 - bVar28;
              abStack_2b8[uVar12 + 1] = (bVar28 * '\b' + (char)uVar13) - 0xb;
              uVar12 = uVar12 + 2;
            }
          }
          if (bVar24 == bVar25) {
            uVar22 = uVar22 + 1;
            if (uVar22 == 6) {
              pmVar16 = d->m_huff_count[2] + 0x10;
              *pmVar16 = *pmVar16 + 1;
              abStack_2b8[uVar12] = 0x10;
              abStack_2b8[uVar12 + 1] = 3;
              goto LAB_00137da5;
            }
LAB_00137da8:
            uVar13 = 0;
          }
          else {
            if (uVar22 != 0) {
              if (uVar22 < 3) {
                (*pamVar1)[uVar17] = (*pamVar1)[uVar17] + (short)uVar22;
                uVar13 = uVar12;
                do {
                  uVar12 = uVar13 + 1;
                  abStack_2b8[uVar13] = bVar25;
                  uVar22 = uVar22 - 1;
                  uVar13 = uVar12;
                } while (uVar22 != 0);
              }
              else {
                pmVar16 = d->m_huff_count[2] + 0x10;
                *pmVar16 = *pmVar16 + 1;
                uVar13 = uVar12 + 1;
                abStack_2b8[uVar12] = 0x10;
                uVar12 = uVar12 + 2;
                abStack_2b8[uVar13] = (char)uVar22 - 3;
              }
            }
            uVar17 = (ulong)uVar12;
            (*pamVar1)[uVar21] = (*pamVar1)[uVar21] + 1;
            uVar12 = uVar12 + 1;
            abStack_2b8[uVar17] = bVar24;
            uVar22 = 0;
            uVar13 = 0;
          }
        }
        uVar23 = uVar23 + 1;
        uVar17 = uVar21;
      } while (uVar23 != (uint)(iVar15 + iVar14));
    }
    if (uVar22 == 0) {
      if (uVar13 != 0) {
        if (uVar13 < 3) {
          (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar13;
          uVar22 = uVar12;
          do {
            uVar12 = uVar22 + 1;
            abStack_2b8[uVar22] = 0;
            uVar13 = uVar13 - 1;
            uVar22 = uVar12;
          } while (uVar13 != 0);
        }
        else {
          if (uVar13 < 0xb) {
            pmVar2 = d->m_huff_count[2] + 0x11;
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar12] = 0x11;
            bVar24 = (char)uVar13 - 3;
          }
          else {
            pmVar2 = d->m_huff_count[2] + 0x12;
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar12] = 0x12;
            bVar24 = (char)uVar13 - 0xb;
          }
          abStack_2b8[uVar12 + 1] = bVar24;
          uVar12 = uVar12 + 2;
        }
      }
    }
    else if (uVar22 < 3) {
      (*pamVar1)[uVar21] = (*pamVar1)[uVar21] + (short)uVar22;
      uVar13 = uVar12;
      do {
        uVar12 = uVar13 + 1;
        abStack_2b8[uVar13] = (byte)uVar21;
        uVar22 = uVar22 - 1;
        uVar13 = uVar12;
      } while (uVar22 != 0);
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x10;
      *pmVar2 = *pmVar2 + 1;
      uVar13 = uVar12 + 1;
      abStack_2b8[uVar12] = 0x10;
      uVar12 = uVar12 + 2;
      abStack_2b8[uVar13] = (char)uVar22 - 3;
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    d->m_bit_buffer = d->m_bit_buffer | 2 << ((byte)d->m_bits_in & 0x1f);
    uVar22 = d->m_bits_in + 2;
    d->m_bits_in = uVar22;
    while (7 < uVar22) {
      pmVar19 = d->m_pOutput_buf;
      if (pmVar19 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar19 + 1;
        *pmVar19 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar22 = d->m_bits_in - 8;
      d->m_bits_in = uVar22;
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar14 + -0x101 << ((byte)uVar22 & 0x1f);
    uVar13 = uVar22 + 5;
    d->m_bits_in = uVar13;
    if (2 < uVar22) {
      do {
        pmVar19 = d->m_pOutput_buf;
        if (pmVar19 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar19 + 1;
          *pmVar19 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar13 = d->m_bits_in - 8;
        d->m_bits_in = uVar13;
      } while (7 < uVar13);
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar15 + -1 << ((byte)uVar13 & 0x1f);
    uVar22 = uVar13 + 5;
    d->m_bits_in = uVar22;
    if (2 < uVar13) {
      do {
        pmVar19 = d->m_pOutput_buf;
        if (pmVar19 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar19 + 1;
          *pmVar19 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar22 = d->m_bits_in - 8;
        d->m_bits_in = uVar22;
      } while (7 < uVar22);
    }
    uVar21 = 0x12;
    do {
      iVar14 = (int)uVar21;
      if (d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar21]] != '\0') goto LAB_00137fb3;
      uVar21 = (ulong)(iVar14 - 1);
    } while (iVar14 != 0);
    iVar14 = -1;
LAB_00137fb3:
    iVar15 = 3;
    if (3 < iVar14) {
      iVar15 = iVar14;
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar15 + -3 << ((byte)uVar22 & 0x1f);
    d->m_bits_in = uVar22 + 4;
    if (3 < uVar22) {
      do {
        pmVar19 = d->m_pOutput_buf;
        if (pmVar19 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar19 + 1;
          *pmVar19 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar22 = d->m_bits_in - 8;
        d->m_bits_in = uVar22;
      } while (7 < uVar22);
    }
    uVar21 = 0;
    do {
      d->m_bit_buffer =
           d->m_bit_buffer |
           (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar21]] << ((byte)d->m_bits_in & 0x1f);
      uVar22 = d->m_bits_in + 3;
      d->m_bits_in = uVar22;
      while (7 < uVar22) {
        pmVar19 = d->m_pOutput_buf;
        if (pmVar19 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar19 + 1;
          *pmVar19 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar22 = d->m_bits_in - 8;
        d->m_bits_in = uVar22;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != iVar15 + 1);
    if (uVar12 != 0) {
      uVar21 = 0;
      do {
        bVar24 = abStack_2b8[uVar21];
        bVar25 = d->m_huff_code_sizes[2][bVar24];
        d->m_bit_buffer =
             d->m_bit_buffer | (uint)d->m_huff_codes[2][bVar24] << ((byte)d->m_bits_in & 0x1f);
        uVar22 = (uint)bVar25 + d->m_bits_in;
        d->m_bits_in = uVar22;
        while (7 < uVar22) {
          pmVar19 = d->m_pOutput_buf;
          if (pmVar19 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar19 + 1;
            *pmVar19 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar22 = d->m_bits_in - 8;
          d->m_bits_in = uVar22;
        }
        uVar13 = (int)uVar21 + 1;
        if (0xf < bVar24) {
          cVar3 = "\x02\x03\a"[bVar24 - 0x10];
          d->m_bit_buffer = d->m_bit_buffer | (uint)abStack_2b8[uVar13] << ((byte)uVar22 & 0x1f);
          uVar13 = (int)uVar21 + 2;
          uVar22 = (int)cVar3 + uVar22;
          d->m_bits_in = uVar22;
          while (7 < uVar22) {
            pmVar19 = d->m_pOutput_buf;
            if (pmVar19 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar19 + 1;
              *pmVar19 = (mz_uint8)d->m_bit_buffer;
            }
            d->m_bit_buffer = d->m_bit_buffer >> 8;
            uVar22 = d->m_bits_in - 8;
            d->m_bits_in = uVar22;
          }
        }
        uVar21 = (ulong)uVar13;
      } while (uVar13 < uVar12);
    }
  }
  else {
    memset(d->m_huff_code_sizes,8,0x90);
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x90) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x91) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x92) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x93) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x94) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x95) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x96) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x97) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x98) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x99) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9a) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9b) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9c) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9d) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9e) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9f) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xab) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xac) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xad) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xae) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xba) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 199) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 200) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xca) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xce) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xda) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xde) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xea) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xeb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xec) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xed) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xee) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xef) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xff) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x100) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x101) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x102) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x103) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x104) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x105) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x106) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x107) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x108) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x109) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10a) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10b) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10c) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10d) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10e) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10f) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x110) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x111) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x112) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x113) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x114) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x115) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x116) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x117) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x118) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x119) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11a) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11b) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11c) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11d) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11e) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11f) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0xf) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x17) = '\x05';
    pamVar7 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar7 + 1) + 0x1f) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    d->m_bit_buffer = d->m_bit_buffer | 1 << ((byte)d->m_bits_in & 0x1f);
    uVar12 = d->m_bits_in + 2;
    d->m_bits_in = uVar12;
    while (7 < uVar12) {
      pmVar19 = d->m_pOutput_buf;
      if (pmVar19 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar19 + 1;
        *pmVar19 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar12 = d->m_bits_in - 8;
      d->m_bits_in = uVar12;
    }
  }
  pbVar4 = d->m_pLZ_code_buf;
  puVar20 = (ulong *)d->m_pOutput_buf;
  uVar21 = (ulong)d->m_bit_buffer;
  uVar12 = d->m_bits_in;
  pmVar19 = d->m_lz_code_buf;
  if (pmVar19 < pbVar4) {
    uVar22 = 1;
    do {
      pmVar18 = pmVar19;
      if (uVar22 == 1) {
        pmVar18 = pmVar19 + 1;
        uVar22 = *pmVar19 | 0x100;
      }
      uVar13 = uVar22;
      if ((uVar22 & 1) == 0) {
        pmVar19 = pmVar18 + 1;
        uVar21 = (ulong)d->m_huff_codes[0][*pmVar18] << ((byte)uVar12 & 0x3f) | uVar21;
        uVar12 = d->m_huff_code_sizes[0][*pmVar18] + uVar12;
        if (((uVar22 & 2) == 0) && (pmVar19 < pbVar4)) {
          uVar13 = uVar22 >> 1;
          pmVar19 = pmVar18 + 2;
          uVar21 = uVar21 | (ulong)d->m_huff_codes[0][pmVar18[1]] << ((byte)uVar12 & 0x3f);
          uVar12 = uVar12 + d->m_huff_code_sizes[0][pmVar18[1]];
          if (((uVar22 & 4) == 0) && (pmVar19 < pbVar4)) {
            pmVar19 = pmVar18 + 3;
            uVar21 = uVar21 | (ulong)d->m_huff_codes[0][pmVar18[2]] << ((byte)uVar12 & 0x3f);
            uVar12 = uVar12 + d->m_huff_code_sizes[0][pmVar18[2]];
            uVar13 = uVar22 >> 2;
          }
        }
      }
      else {
        bVar24 = *pmVar18;
        iVar14 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar24]] + uVar12;
        uVar22 = (uint)*(ushort *)(pmVar18 + 1);
        pmVar19 = pmVar18 + 3;
        iVar15 = iVar14 + (uint)""[bVar24];
        uVar5 = *(ushort *)(pmVar18 + 1) >> 8;
        pbVar27 = "" + uVar5;
        pbVar6 = "" + uVar5;
        if (uVar22 < 0x200) {
          pbVar27 = "" + (uVar22 & 0x1ff);
          pbVar6 = "" + (uVar22 & 0x1ff);
        }
        iVar10 = (uint)d->m_huff_code_sizes[1][*pbVar6] + iVar15;
        uVar21 = (ulong)(mz_bitmasks[""[bVar24]] & (uint)bVar24) << ((byte)iVar14 & 0x3f) |
                 (ulong)d->m_huff_codes[0][s_tdefl_len_sym[bVar24]] << ((byte)uVar12 & 0x3f) |
                 (ulong)d->m_huff_codes[1][*pbVar6] << ((byte)iVar15 & 0x3f) |
                 (ulong)(uVar22 & mz_bitmasks[*pbVar27]) << ((byte)iVar10 & 0x3f) | uVar21;
        uVar12 = iVar10 + (uint)*pbVar27;
      }
      if (d->m_pOutput_buf_end <= puVar20) {
        return 0;
      }
      *puVar20 = uVar21;
      puVar20 = (ulong *)((long)puVar20 + (ulong)(uVar12 >> 3));
      uVar21 = uVar21 >> ((byte)uVar12 & 0x38);
      uVar12 = uVar12 & 7;
      uVar22 = uVar13 >> 1;
    } while (pmVar19 < pbVar4);
  }
  d->m_pOutput_buf = (mz_uint8 *)puVar20;
  d->m_bits_in = 0;
  d->m_bit_buffer = 0;
  for (; uVar12 != 0; uVar12 = uVar12 - (int)uVar17) {
    uVar17 = 0x10;
    if (uVar12 < 0x10) {
      uVar17 = (ulong)uVar12;
    }
    d->m_bit_buffer =
         d->m_bit_buffer | (mz_bitmasks[uVar17] & (uint)uVar21) << ((byte)d->m_bits_in & 0x1f);
    uVar22 = (int)uVar17 + d->m_bits_in;
    d->m_bits_in = uVar22;
    while (7 < uVar22) {
      pmVar19 = d->m_pOutput_buf;
      if (pmVar19 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar19 + 1;
        *pmVar19 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar22 = d->m_bits_in - 8;
      d->m_bits_in = uVar22;
    }
    uVar21 = uVar21 >> ((byte)uVar17 & 0x3f);
  }
  bVar24 = d->m_huff_code_sizes[0][0x100];
  d->m_bit_buffer = d->m_bit_buffer | (uint)d->m_huff_codes[0][0x100] << ((byte)d->m_bits_in & 0x1f)
  ;
  uVar12 = (uint)bVar24 + d->m_bits_in;
  d->m_bits_in = uVar12;
  while (7 < uVar12) {
    pmVar19 = d->m_pOutput_buf;
    if (pmVar19 < d->m_pOutput_buf_end) {
      d->m_pOutput_buf = pmVar19 + 1;
      *pmVar19 = (mz_uint8)d->m_bit_buffer;
    }
    d->m_bit_buffer = d->m_bit_buffer >> 8;
    uVar12 = d->m_bits_in - 8;
    d->m_bits_in = uVar12;
  }
  return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor* d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}